

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectInterfacePerModuleSource.cpp
# Opt level: O1

void __thiscall PerModuleInterface::PerModuleInterface(PerModuleInterface *this)

{
  (this->super_IPerModuleInterface)._vptr_IPerModuleInterface =
       (_func_int **)&PTR_GetConstructors_0010cd48;
  (this->m_ObjectConstructors).
  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ObjectConstructors).
  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ObjectConstructors).
  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_RequiredSourceFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_RequiredSourceFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_RequiredSourceFiles).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ModuleFilename)._M_dataplus._M_p = (pointer)&(this->m_ModuleFilename).field_2;
  (this->m_ModuleFilename)._M_string_length = 0;
  (this->m_ModuleFilename).field_2._M_local_buf[0] = '\0';
  AddRequiredSourceFiles
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dtmoodie[P]RuntimeCompiledCPlusPlus/Aurora/RuntimeObjectSystem/ObjectInterfacePerModuleSource.cpp"
            );
  return;
}

Assistant:

PerModuleInterface::PerModuleInterface()
{
    //ensure this file gets compiled
    AddRequiredSourceFiles( __FILE__ );
}